

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataVariableNames.cpp
# Opt level: O0

void findMetadataVariableNames(Module *module,Program *program)

{
  bool bVar1;
  uint uVar2;
  StringRef *this;
  Function *pFVar3;
  undefined1 auVar4 [16];
  CallInst *CI;
  Instruction *ins;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  Block *myBlock;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Func *func;
  Function *function;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Function *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  Module *in_stack_ffffffffffffff40;
  Func *in_stack_ffffffffffffff48;
  Function *in_stack_ffffffffffffff50;
  Program *in_stack_ffffffffffffff58;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_88;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_80;
  reference local_78;
  Block *local_70;
  reference local_68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_60;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_58;
  reference local_50;
  Func *local_48;
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_18;
  
  local_28 = llvm::Module::functions(in_stack_ffffffffffffff40);
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(local_18);
  auVar4._8_8_ = in_stack_ffffffffffffff40;
  auVar4._0_8_ = in_stack_ffffffffffffff38;
  while( true ) {
    bVar1 = llvm::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x28f2a9);
    local_48 = Program::getFunction(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_50 = local_40;
    local_58.NodePtr = (node_pointer)llvm::Function::begin(in_stack_ffffffffffffff28);
    local_60.NodePtr = (node_pointer)llvm::Function::end(in_stack_ffffffffffffff28);
    while (bVar1 = llvm::operator!=(&local_58,&local_60), bVar1) {
      local_68 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)0x28f32d);
      local_70 = Func::getBlock(in_stack_ffffffffffffff48,auVar4._8_8_);
      local_78 = local_68;
      local_80.NodePtr =
           (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_ffffffffffffff28);
      local_88.NodePtr =
           (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff28);
      while (bVar1 = llvm::operator!=(&local_80,&local_88), bVar1) {
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
        ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                     *)0x28f393);
        uVar2 = llvm::Instruction::getOpcode((Instruction *)0x28f3a2);
        if (uVar2 == 0x38) {
          this = (StringRef *)
                 llvm::cast<llvm::CallInst,llvm::Instruction_const>((Instruction *)0x28f3b5);
          pFVar3 = llvm::CallBase::getCalledFunction(auVar4._0_8_);
          if (pFVar3 != (Function *)0x0) {
            llvm::CallBase::getCalledFunction(auVar4._0_8_);
            auVar4 = llvm::Value::getName();
            llvm::StringRef::str_abi_cxx11_(this);
            in_stack_ffffffffffffff34 = std::__cxx11::string::compare(&stack0xffffffffffffff48);
            std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
            if (in_stack_ffffffffffffff34 == 0) {
              setMetadataInfo((CallInst *)func,(Block *)__range2);
            }
          }
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                      *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  Program::addPass(auVar4._8_8_,auVar4._4_4_);
  return;
}

Assistant:

void findMetadataVariableNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateAllocas));

    for (const auto& function : module->functions()) {
        auto* func = program.getFunction(&function);
        for (const auto& block : function) {
            auto* myBlock = func->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const llvm::CallInst* CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction()) {
                        if (CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                            setMetadataInfo(CI, myBlock);
                        }
                    }
                }
            }

        }
    }

    program.addPass(PassType::FindMetadataVariableNames);
}